

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order5c
              (sunrealtype *b,sunrealtype **A1,sunrealtype *c1,sunrealtype **A2,sunrealtype *c2,
              int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *b_01;
  void *__ptr;
  ulong uVar2;
  size_t __nmemb;
  double dVar3;
  
  __nmemb = (size_t)s;
  b_00 = (sunrealtype *)calloc(__nmemb,8);
  b_01 = (sunrealtype *)calloc(__nmemb,8);
  __ptr = calloc(__nmemb,8);
  iVar1 = arkode_butcher_mv(A1,c1,s,b_00);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A2,c2,s,b_01), iVar1 == 0)) && (0 < s)) &&
     (((b_00 != (sunrealtype *)0x0 && (b_01 != (sunrealtype *)0x0)) && (__ptr != (void *)0x0)))) {
    uVar2 = 0;
    do {
      *(double *)((long)__ptr + uVar2 * 8) = b_00[uVar2] * b_01[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)s != uVar2);
    if (b != (sunrealtype *)0x0) {
      dVar3 = 0.0;
      uVar2 = 0;
      do {
        dVar3 = dVar3 + b[uVar2] * *(double *)((long)__ptr + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while ((uint)s != uVar2);
      free(b_00);
      free(b_01);
      free(__ptr);
      return (uint)(ABS(dVar3 + -0.05) <= 1.4901161193847656e-08);
    }
  }
  else {
    free(b_00);
    free(b_01);
    free(__ptr);
  }
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order5c(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype* c1, sunrealtype** A2,
                                             sunrealtype* c2, int s)
{
  sunrealtype bAcAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp3 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A1, c1, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, c2, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(tmp1, tmp2, s, tmp3))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp3, s, &bAcAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  free(tmp3);
  return (SUNRabs(bAcAc - SUN_RCONST(0.05)) > TOL) ? SUNFALSE : SUNTRUE;
}